

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap-inl.h
# Opt level: O2

void __thiscall
AddressMap<int>::Iterate(AddressMap<int> *this,FunctionRef<void_(const_void_*,_int_*)> body)

{
  long lVar1;
  Cluster *pCVar2;
  int b;
  long lVar3;
  Entry *pEVar4;
  
  for (lVar1 = 0; lVar1 != 0x1000; lVar1 = lVar1 + 1) {
    pCVar2 = (Cluster *)(this->hashtable_ + lVar1);
    while (pCVar2 = pCVar2->next, pCVar2 != (Cluster *)0x0) {
      for (lVar3 = 0; lVar3 != 0x2000; lVar3 = lVar3 + 1) {
        pEVar4 = (Entry *)(pCVar2->blocks + lVar3);
        while (pEVar4 = pEVar4->next, pEVar4 != (Entry *)0x0) {
          (*body.fn)(pEVar4->key,&pEVar4->value,body.data);
        }
      }
    }
  }
  return;
}

Assistant:

void AddressMap<Value>::Iterate(tcmalloc::FunctionRef<void(Key, Value*)> body) const {
  // We could optimize this by traversing only non-empty clusters and/or blocks
  // but it does not speed up heap-checker noticeably.
  for (int h = 0; h < kHashSize; ++h) {
    for (const Cluster* c = hashtable_[h]; c != nullptr; c = c->next) {
      for (int b = 0; b < kClusterBlocks; ++b) {
        for (Entry* e = c->blocks[b]; e != nullptr; e = e->next) {
          body(e->key, &e->value);
        }
      }
    }
  }
}